

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

HeapArgumentsObject * __thiscall
Js::JavascriptLibrary::CreateHeapArguments
          (JavascriptLibrary *this,Var frameObj,uint32 formalCount,bool isStrictMode)

{
  Recycler *this_00;
  DynamicType *type;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *alloc;
  HeapArgumentsObject *this_01;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if ((this->heapArgumentsType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1713,"(heapArgumentsType)","Where\'s heapArgumentsType?");
    if (!bVar2) goto LAB_00aa5608;
    *puVar3 = 0;
  }
  data._36_4_ = formalCount;
  if ((this->strictHeapArgumentsType).ptr == (DynamicType *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1714,"(strictHeapArgumentsType)","strictHeapArgumentsType");
    if (!bVar2) {
LAB_00aa5608:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = this->recycler;
  EnsureArrayPrototypeValuesFunction(this);
  type = (&this->heapArgumentsType)[isStrictMode].ptr;
  data.typeinfo = (type_info *)((ulong)((type->typeHandler).ptr)->inlineSlotCapacity << 3);
  local_60 = (undefined1  [8])&HeapArgumentsObject::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x171e;
  alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
  this_01 = (HeapArgumentsObject *)new<Memory::Recycler>(0x38,alloc,0x398e98,0);
  if ((this->super_JavascriptLibraryBase).nullValue.ptr == (RecyclableObject *)frameObj) {
    frameObj = (ActivationObject *)0x0;
  }
  HeapArgumentsObject::HeapArgumentsObject
            (this_01,this_00,(ActivationObject *)frameObj,data._36_4_,type);
  return this_01;
}

Assistant:

HeapArgumentsObject* JavascriptLibrary::CreateHeapArguments(Var frameObj, uint32 formalCount, bool isStrictMode)
    {
        AssertMsg(heapArgumentsType, "Where's heapArgumentsType?");
        Assert(strictHeapArgumentsType);

        Recycler *recycler = this->GetRecycler();

        EnsureArrayPrototypeValuesFunction(); //InitializeArrayPrototype can be delay loaded, which could prevent us from access to array.prototype.values

        DynamicType * argumentsType = isStrictMode ? strictHeapArgumentsType : heapArgumentsType;

        return RecyclerNewPlusZ(recycler, argumentsType->GetTypeHandler()->GetInlineSlotCapacity() * sizeof(Var), HeapArgumentsObject, recycler,
            frameObj != GetNull() ? static_cast<ActivationObject*>(frameObj) : nullptr,
            formalCount, argumentsType);
    }